

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::enteringInitializingMode(Federate *this,IterationResult iterating)

{
  element_type *peVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  updateFederateMode(this,INITIALIZING);
  peVar1 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Core[0x21])(peVar1,(ulong)(uint)(this->fedID).fid);
  (this->mCurrentTime).internalTimeCode = CONCAT44(extraout_var,iVar2);
  if (iterating == NEXT_STEP) {
    (*this->_vptr_Federate[0xb])(this);
  }
  if ((this->initializingEntryCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    uStack_18 = CONCAT17(iterating != NEXT_STEP,(undefined7)uStack_18);
    (*(this->initializingEntryCallback)._M_invoker)
              ((_Any_data *)&this->initializingEntryCallback,(bool *)((long)&uStack_18 + 7));
  }
  return;
}

Assistant:

void Federate::enteringInitializingMode(IterationResult iterating)
{
    updateFederateMode(Modes::INITIALIZING);
    mCurrentTime = coreObject->getCurrentTime(fedID);
    if (iterating == IterationResult::NEXT_STEP) {
        startupToInitializeStateTransition();
    }
    if (initializingEntryCallback) {
        initializingEntryCallback(iterating != IterationResult::NEXT_STEP);
    }
}